

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O0

int AnalyseBufHdrHexBinLenSeanet(uchar *buf,int buflen,int *pExpectedMsgLen)

{
  int iVar1;
  int iVar2;
  int HexLength;
  int *pExpectedMsgLen_local;
  int buflen_local;
  uchar *buf_local;
  
  if (buflen < 7) {
    buf_local._4_4_ = 1;
  }
  else if (*buf == '@') {
    iVar1 = GetHexLengthSeanet(buf);
    iVar2 = GetBinLengthSeanet(buf);
    if (iVar1 == iVar2) {
      *pExpectedMsgLen = iVar1 + 6;
      buf_local._4_4_ = 0;
    }
    else {
      buf_local._4_4_ = 1;
    }
  }
  else {
    buf_local._4_4_ = 1;
  }
  return buf_local._4_4_;
}

Assistant:

inline int AnalyseBufHdrHexBinLenSeanet(unsigned char* buf, int buflen, int* pExpectedMsgLen)
{
	int HexLength = 0;

	if (buflen < 7)
	{
		//PRINT_DEBUG_MESSAGE_SEANETCORE(("Invalid number of bytes\n"));
		return EXIT_FAILURE;
	}
	if (buf[0] != MESSAGE_HEADER_SEANET)
	{
		//PRINT_DEBUG_MESSAGE_SEANETCORE(("Invalid message header\n"));
		return EXIT_FAILURE;
	}
	HexLength = GetHexLengthSeanet(buf);
	if (HexLength != GetBinLengthSeanet(buf))
	{
		//PRINT_DEBUG_MESSAGE_SEANETCORE(("Invalid Hex or Bin Length\n"));
		return EXIT_FAILURE;
	}

	*pExpectedMsgLen = HexLength+6;

	return EXIT_SUCCESS;
}